

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O0

void erase(FT_HANDLE ftHandle)

{
  int iVar1;
  ostream *poVar2;
  FT_STATUS ftStatus;
  FT_HANDLE ftHandle_local;
  
  std::operator<<((ostream *)&std::cout,"Erasing... ");
  iVar1 = FT_EraseEE(ftHandle);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Done.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in erasing device!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    FT_Close(ftHandle);
  }
  return;
}

Assistant:

void erase(FT_HANDLE ftHandle) {
    cout << "Erasing... ";
    FT_STATUS ftStatus = FT_EraseEE(ftHandle);
    if (ftStatus != FT_OK) // Did the command execute OK?
    {
        cerr << "Error in erasing device!" << endl;
        FT_Close(ftHandle);
        return;
    }
    cout << "Done." << endl;
}